

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_157::TranslateToExnref::~TranslateToExnref(TranslateToExnref *this)

{
  pointer pTVar1;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__TranslateToExnref_01076648;
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->typeToScratchLocal)._M_h);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->delegateTargetToTrampoline)._M_h);
  std::_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>::
  _M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
            *)&this->localAssigner);
  std::_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
  ::_M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
              *)&this->labelScanner);
  if ((this->labels).super__Optional_base<wasm::LabelUtils::LabelManager,_false,_false>._M_payload.
      super__Optional_payload<wasm::LabelUtils::LabelManager,_true,_false,_false>.
      super__Optional_payload_base<wasm::LabelUtils::LabelManager>._M_engaged == true) {
    std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::_M_destroy
              ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)&this->labels);
  }
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
           ).
           super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
           .
           super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                                          .
                                          super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x538);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }